

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintTools.h
# Opt level: O0

void PrintTools::PrintVectorCout<unsigned_int>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  ostream *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_000001a8;
  string local_28 [40];
  
  SoftPrintVector<unsigned_int>(in_stack_000001a8);
  this = std::operator<<((ostream *)&std::cout,local_28);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

static void PrintVectorCout(const std::vector<T> &v)
{
    std::cout << SoftPrintVector(v) << std::endl;
}